

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void cmTargetCheckLINK_INTERFACE_LIBRARIES
               (string *prop,char *value,cmMakefile *context,bool imported)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [8];
  ostringstream e;
  char *base;
  bool imported_local;
  cmMakefile *context_local;
  char *value_local;
  string *prop_local;
  
  if ((cmTargetCheckLINK_INTERFACE_LIBRARIES(std::__cxx11::string_const&,char_const*,cmMakefile*,bool)
       ::keys == '\0') &&
     (iVar2 = __cxa_guard_acquire(&cmTargetCheckLINK_INTERFACE_LIBRARIES(std::__cxx11::string_const&,char_const*,cmMakefile*,bool)
                                   ::keys), iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&cmTargetCheckLINK_INTERFACE_LIBRARIES::keys,"(^|;)(debug|optimized|general)(;|$)");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                 &cmTargetCheckLINK_INTERFACE_LIBRARIES::keys,&__dso_handle);
    __cxa_guard_release(&cmTargetCheckLINK_INTERFACE_LIBRARIES(std::__cxx11::string_const&,char_const*,cmMakefile*,bool)
                         ::keys);
  }
  bVar1 = cmsys::RegularExpression::find(&cmTargetCheckLINK_INTERFACE_LIBRARIES::keys,value);
  if (bVar1) {
    pcVar3 = "LINK_INTERFACE_LIBRARIES";
    if (imported) {
      pcVar3 = "IMPORTED_LINK_INTERFACE_LIBRARIES";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    poVar4 = std::operator<<((ostream *)local_1b8,"Property ");
    poVar4 = std::operator<<(poVar4,(string *)prop);
    poVar4 = std::operator<<(poVar4," may not contain link-type keyword \"");
    cmsys::RegularExpression::match_abi_cxx11_
              (&local_1d8,&cmTargetCheckLINK_INTERFACE_LIBRARIES::keys,2);
    poVar4 = std::operator<<(poVar4,(string *)&local_1d8);
    poVar4 = std::operator<<(poVar4,"\".  ");
    poVar4 = std::operator<<(poVar4,"The ");
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," property has a per-configuration ");
    poVar4 = std::operator<<(poVar4,"version called ");
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4,"_<CONFIG> which may be ");
    std::operator<<(poVar4,"used to specify per-configuration rules.");
    std::__cxx11::string::~string((string *)&local_1d8);
    if (!imported) {
      poVar4 = std::operator<<((ostream *)local_1b8,"  ");
      poVar4 = std::operator<<(poVar4,
                               "Alternatively, an IMPORTED library may be created, configured ");
      poVar4 = std::operator<<(poVar4,"with a per-configuration location, and then named in the ");
      poVar4 = std::operator<<(poVar4,"property value.  ");
      poVar4 = std::operator<<(poVar4,"See the add_library command\'s IMPORTED mode for details.");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"If you have a list of libraries that already contains the ");
      poVar4 = std::operator<<(poVar4,"keyword, use the target_link_libraries command with its ");
      poVar4 = std::operator<<(poVar4,"LINK_INTERFACE_LIBRARIES mode to set the property.  ");
      poVar4 = std::operator<<(poVar4,
                               "The command automatically recognizes link-type keywords and sets ");
      poVar4 = std::operator<<(poVar4,
                               "the LINK_INTERFACE_LIBRARIES and LINK_INTERFACE_LIBRARIES_DEBUG ");
      std::operator<<(poVar4,"properties accordingly.");
    }
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1f8,false);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  }
  return;
}

Assistant:

static void cmTargetCheckLINK_INTERFACE_LIBRARIES(
  const std::string& prop, const char* value, cmMakefile* context,
  bool imported)
{
  // Look for link-type keywords in the value.
  static cmsys::RegularExpression
    keys("(^|;)(debug|optimized|general)(;|$)");
  if(!keys.find(value))
    {
    return;
    }

  // Support imported and non-imported versions of the property.
  const char* base = (imported?
                      "IMPORTED_LINK_INTERFACE_LIBRARIES" :
                      "LINK_INTERFACE_LIBRARIES");

  // Report an error.
  std::ostringstream e;
  e << "Property " << prop << " may not contain link-type keyword \""
    << keys.match(2) << "\".  "
    << "The " << base << " property has a per-configuration "
    << "version called " << base << "_<CONFIG> which may be "
    << "used to specify per-configuration rules.";
  if(!imported)
    {
    e << "  "
      << "Alternatively, an IMPORTED library may be created, configured "
      << "with a per-configuration location, and then named in the "
      << "property value.  "
      << "See the add_library command's IMPORTED mode for details."
      << "\n"
      << "If you have a list of libraries that already contains the "
      << "keyword, use the target_link_libraries command with its "
      << "LINK_INTERFACE_LIBRARIES mode to set the property.  "
      << "The command automatically recognizes link-type keywords and sets "
      << "the LINK_INTERFACE_LIBRARIES and LINK_INTERFACE_LIBRARIES_DEBUG "
      << "properties accordingly.";
    }
  context->IssueMessage(cmake::FATAL_ERROR, e.str());
}